

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O1

char __thiscall
rapidxml::xml_document<char>::parse_and_append_data<0>
          (xml_document<char> *this,xml_node<char> *node,char **text,char *contents_start)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  xml_node<char> *child;
  char *pcVar4;
  
  *text = contents_start;
  pcVar3 = skip_and_expand_character_refs<rapidxml::xml_document<char>::text_pred,rapidxml::xml_document<char>::text_pure_no_ws_pred,0>
                     (text);
  child = (xml_node<char> *)memory_pool<char>::allocate_aligned(&this->super_memory_pool<char>,0x60)
  ;
  (child->super_xml_base<char>).m_parent = (xml_node<char> *)0x0;
  (child->super_xml_base<char>).m_name = (char *)0x0;
  (child->super_xml_base<char>).m_value = (char *)0x0;
  child->m_type = node_data;
  child->m_first_node = (xml_node<char> *)0x0;
  child->m_first_attribute = (xml_attribute<char> *)0x0;
  (child->super_xml_base<char>).m_value = contents_start;
  (child->super_xml_base<char>).m_value_size = (long)pcVar3 - (long)contents_start;
  xml_node<char>::append_node(node,child);
  pcVar2 = (node->super_xml_base<char>).m_value;
  pcVar4 = &xml_base<char>::nullstr()::zero;
  if (pcVar2 != (char *)0x0) {
    pcVar4 = pcVar2;
  }
  if (*pcVar4 == '\0') {
    (node->super_xml_base<char>).m_value = contents_start;
    (node->super_xml_base<char>).m_value_size = (long)pcVar3 - (long)contents_start;
  }
  cVar1 = **text;
  *pcVar3 = '\0';
  return cVar1;
}

Assistant:

Ch parse_and_append_data(xml_node<Ch> *node, Ch *&text, Ch *contents_start)
        {
            // Backup to contents start if whitespace trimming is disabled
            if (!(Flags & parse_trim_whitespace))
                text = contents_start;     
            
            // Skip until end of data
            Ch *value = text, *end;
            if (Flags & parse_normalize_whitespace)
                end = skip_and_expand_character_refs<text_pred, text_pure_with_ws_pred, Flags>(text);   
            else
                end = skip_and_expand_character_refs<text_pred, text_pure_no_ws_pred, Flags>(text);

            // Trim trailing whitespace if flag is set; leading was already trimmed by whitespace skip after >
            if (Flags & parse_trim_whitespace)
            {
                if (Flags & parse_normalize_whitespace)
                {
                    // Whitespace is already condensed to single space characters by skipping function, so just trim 1 char off the end
                    if (*(end - 1) == Ch(' '))
                        --end;
                }
                else
                {
                    // Backup until non-whitespace character is found
                    while (whitespace_pred::test(*(end - 1)))
                        --end;
                }
            }
            
            // If characters are still left between end and value (this test is only necessary if normalization is enabled)
            // Create new data node
            if (!(Flags & parse_no_data_nodes))
            {
                xml_node<Ch> *data = this->allocate_node(node_data);
                data->value(value, end - value);
                node->append_node(data);
            }

            // Add data to parent node if no data exists yet
            if (!(Flags & parse_no_element_values)) 
                if (*node->value() == Ch('\0'))
                    node->value(value, end - value);

            // Place zero terminator after value
            if (!(Flags & parse_no_string_terminators))
            {
                Ch ch = *text;
                *end = Ch('\0');
                return ch;      // Return character that ends data; this is required because zero terminator overwritten it
            }

            // Return character that ends data
            return *text;
        }